

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void DoReadyWeaponDisableSwitch(AActor *self,INTBOOL disable)

{
  player_t *ppVar1;
  ushort uVar2;
  
  if ((self != (AActor *)0x0) && (ppVar1 = self->player, ppVar1 != (player_t *)0x0)) {
    uVar2 = ppVar1->WeaponState & 0xffef;
    if (disable != 0) {
      uVar2 = ppVar1->WeaponState & 0xff6f | 0x10;
    }
    ppVar1->WeaponState = uVar2;
  }
  return;
}

Assistant:

void DoReadyWeaponDisableSwitch (AActor *self, INTBOOL disable)
{
	// Discard all switch attempts?
	player_t *player;
	if (self && (player = self->player))
	{
		if (disable)
		{
			player->WeaponState |= WF_DISABLESWITCH;
			player->WeaponState &= ~WF_REFIRESWITCHOK;
		}
		else
		{
			player->WeaponState &= ~WF_DISABLESWITCH;
		}
	}
}